

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

treeNode * ID(void)

{
  treeNode *this;
  string local_38;
  
  match(ID,lackIdentifiter);
  this = (treeNode *)operator_new(0x58);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,preToken.text._M_dataplus._M_p,
             preToken.text._M_dataplus._M_p + preToken.text._M_string_length);
  treeNode::treeNode(this,idExp,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return this;
}

Assistant:

treeNode* ID()
{
    match(Token::ID,Error::lackIdentifiter);
    return new treeNode(ExpKind::idExp,preToken.text);
}